

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Joint::removeJoint(Joint *this,Scene *scene)

{
  pointer ppJVar1;
  Joint *pJVar2;
  Skeleton *pSVar3;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  _Var4;
  pointer ppJVar5;
  Skeleton *local_28;
  
  local_28 = this->skeleton;
  if (local_28->root != this) {
    ppJVar1 = (this->kids).
              super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppJVar5 = (this->kids).
                   super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppJVar5 != ppJVar1;
        ppJVar5 = ppJVar5 + 1) {
      if (*ppJVar5 != this) {
        removeJoint(*ppJVar5,scene);
      }
    }
    Scene::removeObject(scene,&this->super_SceneObject);
    pJVar2 = this->parent;
    local_28 = (Skeleton *)this;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,__gnu_cxx::__ops::_Iter_equals_val<CMU462::DynamicScene::Joint*const>>
                      ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pJVar2->kids).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pJVar2->kids).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<CMU462::DynamicScene::Joint_*const>)&local_28);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    erase(&pJVar2->kids,(const_iterator)_Var4._M_current,
          (const_iterator)
          (pJVar2->kids).
          super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
          ._M_impl.super__Vector_impl_data._M_finish);
    pSVar3 = this->skeleton;
    local_28 = (Skeleton *)this;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,__gnu_cxx::__ops::_Iter_equals_val<CMU462::DynamicScene::Joint*const>>
                      ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pSVar3->joints).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pSVar3->joints).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<CMU462::DynamicScene::Joint_*const>)&local_28);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    erase(&pSVar3->joints,(const_iterator)_Var4._M_current,
          (const_iterator)
          (pSVar3->joints).
          super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
          ._M_impl.super__Vector_impl_data._M_finish);
    ~Joint(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void Joint::removeJoint(Scene* scene) {
  if (this == skeleton->root) return;

  for (auto childJoint : kids) {
    if (childJoint != this) childJoint->removeJoint(scene);
  }

  scene->removeObject(this);

  auto& kids = parent->kids;
  kids.erase(std::remove(kids.begin(), kids.end(), this), kids.end());

  auto& joints = skeleton->joints;
  joints.erase(std::remove(joints.begin(), joints.end(), this), joints.end());

  delete this;
}